

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncCloseFunc(xmlCharEncodingHandler *handler)

{
  xmlCharEncodingHandlerPtr *ppxVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  iconv_t __cd;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    return -1;
  }
  if (handler->name == (char *)0x0) {
    return -1;
  }
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)nbCharEncodingHandler;
    if (nbCharEncodingHandler < 1) {
      uVar3 = uVar4;
    }
    while (uVar3 != uVar4) {
      ppxVar1 = handlers + uVar4;
      uVar4 = uVar4 + 1;
      if (*ppxVar1 == handler) {
        return 0;
      }
    }
  }
  if (handler->iconv_out == (iconv_t)0x0) {
    __cd = handler->iconv_in;
    uVar5 = 0;
    if (__cd == (iconv_t)0x0) {
      return 0;
    }
  }
  else {
    iVar2 = iconv_close(handler->iconv_out);
    uVar5 = -(uint)(iVar2 != 0);
    handler->iconv_out = (iconv_t)0x0;
    __cd = handler->iconv_in;
    if (__cd == (iconv_t)0x0) goto LAB_001448f0;
  }
  iVar2 = iconv_close(__cd);
  uVar5 = uVar5 | -(uint)(iVar2 != 0);
  handler->iconv_in = (iconv_t)0x0;
LAB_001448f0:
  if (handler->name != (char *)0x0) {
    (*xmlFree)(handler->name);
  }
  handler->name = (char *)0x0;
  (*xmlFree)(handler);
  return uVar5;
}

Assistant:

int
xmlCharEncCloseFunc(xmlCharEncodingHandler *handler) {
    int ret = 0;
    int tofree = 0;
    int i, handler_in_list = 0;

    if (handler == NULL) return(-1);
    if (handler->name == NULL) return(-1);
    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (handler == handlers[i]) {
	        handler_in_list = 1;
		break;
	    }
	}
    }
#ifdef LIBXML_ICONV_ENABLED
    /*
     * Iconv handlers can be used only once, free the whole block.
     * and the associated icon resources.
     */
    if ((handler_in_list == 0) &&
        ((handler->iconv_out != NULL) || (handler->iconv_in != NULL))) {
        tofree = 1;
	if (handler->iconv_out != NULL) {
	    if (iconv_close(handler->iconv_out))
		ret = -1;
	    handler->iconv_out = NULL;
	}
	if (handler->iconv_in != NULL) {
	    if (iconv_close(handler->iconv_in))
		ret = -1;
	    handler->iconv_in = NULL;
	}
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    if ((handler_in_list == 0) &&
        ((handler->uconv_out != NULL) || (handler->uconv_in != NULL))) {
        tofree = 1;
	if (handler->uconv_out != NULL) {
	    closeIcuConverter(handler->uconv_out);
	    handler->uconv_out = NULL;
	}
	if (handler->uconv_in != NULL) {
	    closeIcuConverter(handler->uconv_in);
	    handler->uconv_in = NULL;
	}
    }
#endif
    if (tofree) {
        /* free up only dynamic handlers iconv/uconv */
        if (handler->name != NULL)
            xmlFree(handler->name);
        handler->name = NULL;
        xmlFree(handler);
    }
#ifdef DEBUG_ENCODING
    if (ret)
        xmlGenericError(xmlGenericErrorContext,
		"failed to close the encoding handler\n");
    else
        xmlGenericError(xmlGenericErrorContext,
		"closed the encoding handler\n");
#endif

    return(ret);
}